

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_initCStream_usingCDict
                 (ZSTDMT_CCtx *mtctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ZSTD_CCtx_params in_stack_fffffffffffffeb8;
  undefined4 local_b8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [12];
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined4 local_7c;
  undefined8 local_78;
  int local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 uStack_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined8 uStack_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  
  uVar4 = (mtctx->params).format;
  if (cdict != (ZSTD_CDict *)0x0) {
    uVar1 = (cdict->matchState).cParams.minMatch;
    uVar2 = (cdict->matchState).cParams.targetLength;
    uVar3 = (cdict->matchState).cParams.strategy;
    local_84 = CONCAT44(uVar2,uVar1);
    local_98._0_4_ = uVar4;
    local_98._4_4_ = (cdict->matchState).cParams.windowLog;
    local_98._8_4_ = (cdict->matchState).cParams.chainLog;
    uStack_8c._0_4_ = (cdict->matchState).cParams.hashLog;
    uStack_8c._4_4_ = (cdict->matchState).cParams.searchLog;
    local_7c = uVar3;
    local_78 = fParams._0_8_;
    local_70 = fParams.noDictIDFlag;
    local_6c._0_4_ = (mtctx->params).compressionLevel;
    local_6c._4_4_ = (mtctx->params).forceWindow;
    uStack_64 = *(undefined8 *)&(mtctx->params).field_0x34;
    uStack_5c = *(undefined8 *)((long)&(mtctx->params).targetCBlockSize + 4);
    uStack_54._0_4_ = (mtctx->params).attachDictPref;
    uStack_54._4_4_ = (mtctx->params).literalCompressionMode;
    local_4c = *(undefined8 *)&(mtctx->params).nbWorkers;
    uStack_44 = *(undefined8 *)((long)&(mtctx->params).jobSize + 4);
    uStack_3c._0_4_ = (mtctx->params).rsyncable;
    uStack_3c._4_4_ = (mtctx->params).ldmParams.enableLdm;
    uStack_34._0_4_ = (mtctx->params).ldmParams.hashLog;
    uStack_34._4_4_ = (mtctx->params).ldmParams.bucketSizeLog;
    local_2c._0_4_ = (mtctx->params).ldmParams.minMatchLength;
    local_2c._4_4_ = (mtctx->params).ldmParams.hashRateLog;
    uStack_24 = *(undefined8 *)&(mtctx->params).ldmParams.windowLog;
    uStack_1c = *(undefined8 *)((long)&(mtctx->params).customMem.customAlloc + 4);
    uStack_14 = *(undefined8 *)((long)&(mtctx->params).customMem.customFree + 4);
    local_c = *(undefined4 *)((long)&(mtctx->params).customMem.opaque + 4);
    puVar7 = (undefined8 *)local_98;
    puVar8 = (undefined8 *)&stack0xfffffffffffffeb8;
    for (lVar6 = 0x12; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + 1;
      puVar8 = puVar8 + 1;
    }
    sVar5 = ZSTDMT_initCStream_internal
                      (mtctx,(void *)0x0,0,ZSTD_dct_auto,cdict,in_stack_fffffffffffffeb8,
                       pledgedSrcSize);
    return sVar5;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTDMT_initCStream_usingCDict(ZSTDMT_CCtx* mtctx,
                               const ZSTD_CDict* cdict,
                                     ZSTD_frameParameters fParams,
                                     unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;
    if (cdict==NULL) return ERROR(dictionary_wrong);   /* method incompatible with NULL cdict */
    cctxParams.cParams = ZSTD_getCParamsFromCDict(cdict);
    cctxParams.fParams = fParams;
    return ZSTDMT_initCStream_internal(mtctx, NULL, 0 /*dictSize*/, ZSTD_dct_auto, cdict,
                                       cctxParams, pledgedSrcSize);
}